

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

int glob_match_url(char **result,char *filename,URLGlob *glob)

{
  URLPatternType UVar1;
  anon_struct_8_4_a75b1b66_for_CharRange aVar2;
  char *__ptr;
  ushort **ppuVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *__s;
  size_t sStack_80;
  char *local_70;
  URLPattern *local_68;
  size_t local_60;
  char **local_58;
  URLGlob *local_50;
  char numbuf [18];
  
  *result = (char *)0x0;
  local_70 = filename;
  local_60 = strlen(filename);
  local_60 = local_60 + 1;
  __ptr = (char *)malloc(local_60);
  if (__ptr == (char *)0x0) {
    return 0x1b;
  }
  local_68 = glob->pattern;
  sStack_80 = 0;
  __s = (char *)0x0;
  uVar6 = 0;
  local_58 = result;
  local_50 = glob;
  do {
    if (*filename == '#') {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (ulong)(byte)filename[1] * 2 + 1) & 8) == 0)
      goto LAB_00112146;
      uVar7 = strtoul(filename + 1,&local_70,10);
      uVar5 = uVar7 - 1;
      if ((uVar7 == 0) || (local_50->size >> 1 < uVar5)) goto LAB_00112146;
      UVar1 = local_68[uVar5].type;
      if (UVar1 == UPTNumRange) {
        __s = numbuf;
        curl_msnprintf(__s,0x12,"%0*d",(int)local_68[uVar5].content.Set.size,
                       local_68[uVar5].content.NumRange.ptr_n);
LAB_00112251:
        sStack_80 = strlen(__s);
      }
      else {
        aVar2 = local_68[uVar5].content.CharRange;
        if (UVar1 == UPTCharRange) {
          numbuf[0] = aVar2.ptr_c;
          numbuf[1] = '\0';
          sStack_80 = 1;
          __s = numbuf;
        }
        else {
          if (UVar1 != UPTSet) {
            curl_mprintf("internal error: invalid pattern type (%d)\n");
            free(__ptr);
            return 2;
          }
          if (aVar2 != (anon_struct_8_4_a75b1b66_for_CharRange)0x0) {
            __s = *(char **)((long)aVar2 + (long)local_68[uVar5].content.Set.ptr_s * 8);
            goto LAB_00112251;
          }
        }
      }
    }
    else {
      if (*filename == '\0') {
        __ptr[uVar6] = '\0';
        *local_58 = __ptr;
        return 0;
      }
LAB_00112146:
      local_70 = filename + 1;
      sStack_80 = 1;
      __s = filename;
    }
    uVar7 = sStack_80 + uVar6;
    pcVar4 = __ptr;
    if (local_60 <= uVar7) {
      pcVar4 = (char *)realloc(__ptr,uVar7 * 2 + 1);
      if (pcVar4 == (char *)0x0) {
        free(__ptr);
        return 0x1b;
      }
      local_60 = uVar7 * 2;
    }
    memcpy(pcVar4 + uVar6,__s,sStack_80);
    filename = local_70;
    uVar6 = uVar7;
    __ptr = pcVar4;
  } while( true );
}

Assistant:

int glob_match_url(char **result, char *filename, URLGlob *glob)
{
  char *target;
  size_t allocsize;
  char numbuf[18];
  char *appendthis = NULL;
  size_t appendlen = 0;
  size_t stringlen = 0;

  *result = NULL;

  /* We cannot use the glob_buffer for storage here since the filename may
   * be longer than the URL we use. We allocate a good start size, then
   * we need to realloc in case of need.
   */
  allocsize = strlen(filename) + 1; /* make it at least one byte to store the
                                       trailing zero */
  target = malloc(allocsize);
  if(!target)
    return CURLE_OUT_OF_MEMORY;

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      unsigned long i;
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      i = num - 1UL;

      if(num && (i <= glob->size / 2)) {
        URLPattern pat = glob->pattern[i];
        switch (pat.type) {
        case UPTSet:
          if(pat.content.Set.elements) {
            appendthis = pat.content.Set.elements[pat.content.Set.ptr_s];
            appendlen =
              strlen(pat.content.Set.elements[pat.content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat.content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          snprintf(numbuf, sizeof(numbuf), "%0*d",
                   pat.content.NumRange.padlength,
                   pat.content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          printf("internal error: invalid pattern type (%d)\n",
                 (int)pat.type);
          Curl_safefree(target);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(appendlen + stringlen >= allocsize) {
      char *newstr;
      /* we append a single byte to allow for the trailing byte to be appended
         at the end of this function outside the while() loop */
      allocsize = (appendlen + stringlen) * 2;
      newstr = realloc(target, allocsize + 1);
      if(!newstr) {
        Curl_safefree(target);
        return CURLE_OUT_OF_MEMORY;
      }
      target = newstr;
    }
    memcpy(&target[stringlen], appendthis, appendlen);
    stringlen += appendlen;
  }
  target[stringlen]= '\0';
  *result = target;
  return CURLE_OK;
}